

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraLcr.c
# Opt level: O2

void Fra_LcrRemapPartitions(Vec_Ptr_t *vParts,Fra_Cla_t *pCla,int *pInToOutPart,int *pInToOutNum)

{
  int iVar1;
  int i;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  int *piVar2;
  undefined8 *puVar3;
  long *plVar4;
  int iVar5;
  int i_00;
  long lVar6;
  int iVar7;
  
  iVar7 = pCla->pAig->nObjs[3] - pCla->pAig->nObjs[2];
  lVar6 = 0;
  while( true ) {
    if (vParts->nSize <= lVar6) {
      return;
    }
    i_00 = (int)lVar6;
    p = (Vec_Int_t *)Vec_PtrEntry(vParts,i_00);
    iVar5 = p->nSize;
    p_00 = (Vec_Int_t *)malloc(0x10);
    if (iVar5 - 1U < 0xf) {
      iVar5 = 0x10;
    }
    p_00->nSize = 0;
    p_00->nCap = iVar5;
    if (iVar5 == 0) {
      piVar2 = (int *)0x0;
    }
    else {
      piVar2 = (int *)malloc((long)iVar5 << 2);
    }
    p_00->pArray = piVar2;
    for (iVar5 = 0; iVar5 < p->nSize; iVar5 = iVar5 + 1) {
      i = Vec_IntEntry(p,iVar5);
      iVar1 = pCla->vClasses->nSize;
      if (i < iVar1) {
        for (puVar3 = (undefined8 *)Vec_PtrEntry(pCla->vClasses,i); plVar4 = (long *)*puVar3,
            plVar4 != (long *)0x0; puVar3 = puVar3 + 1) {
          pInToOutPart[*plVar4] = i_00;
          pInToOutNum[*plVar4] = p_00->nSize;
          Vec_IntPush(p_00,(int)*plVar4 + iVar7);
        }
      }
      else {
        plVar4 = (long *)Vec_PtrEntry(pCla->vClasses1,i - iVar1);
        pInToOutPart[*plVar4] = i_00;
        pInToOutNum[*plVar4] = p_00->nSize;
        Vec_IntPush(p_00,(int)*plVar4 + iVar7);
      }
    }
    if (vParts->nSize <= lVar6) break;
    vParts->pArray[lVar6] = p_00;
    free(p->pArray);
    free(p);
    lVar6 = lVar6 + 1;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
}

Assistant:

void Fra_LcrRemapPartitions( Vec_Ptr_t * vParts, Fra_Cla_t * pCla, int * pInToOutPart, int * pInToOutNum )
{
    Vec_Int_t * vOne, * vOneNew;
    Aig_Obj_t ** ppClass, * pObjPi;
    int Out, Offset, i, k, c;
    // compute the LO/LI offset
    Offset = Aig_ManCoNum(pCla->pAig) - Aig_ManCiNum(pCla->pAig);
    Vec_PtrForEachEntry( Vec_Int_t *, vParts, vOne, i )
    {
        vOneNew = Vec_IntAlloc( Vec_IntSize(vOne) );
        Vec_IntForEachEntry( vOne, Out, k )
        {
            if ( Out < Vec_PtrSize(pCla->vClasses) )
            {
                ppClass = (Aig_Obj_t **)Vec_PtrEntry( pCla->vClasses, Out );
                for ( c = 0; ppClass[c]; c++ )
                {
                    pInToOutPart[(long)ppClass[c]->pNext] = i;
                    pInToOutNum[(long)ppClass[c]->pNext] = Vec_IntSize(vOneNew);
                    Vec_IntPush( vOneNew, Offset+(long)ppClass[c]->pNext );
                }
            }
            else
            {
                pObjPi = (Aig_Obj_t *)Vec_PtrEntry( pCla->vClasses1, Out - Vec_PtrSize(pCla->vClasses) );
                pInToOutPart[(long)pObjPi->pNext] = i;
                pInToOutNum[(long)pObjPi->pNext] = Vec_IntSize(vOneNew);
                Vec_IntPush( vOneNew, Offset+(long)pObjPi->pNext );
            }
        }
        // replace the class
        Vec_PtrWriteEntry( vParts, i, vOneNew );
        Vec_IntFree( vOne );
    }
}